

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O2

void __thiscall CaDiCaL::LratChecker::dump(LratChecker *this)

{
  uint uVar1;
  uint64_t i;
  uint64_t uVar2;
  uint i_3;
  LratCheckerClause *pLVar3;
  uint i_1;
  ulong uVar4;
  uint uVar5;
  uint64_t i_2;
  ulong uVar6;
  
  uVar6 = 0;
  for (uVar2 = 0; uVar2 != this->size_clauses; uVar2 = uVar2 + 1) {
    pLVar3 = (LratCheckerClause *)(this->clauses + uVar2);
    while (pLVar3 = pLVar3->next, pLVar3 != (LratCheckerClause *)0x0) {
      for (uVar4 = 0; pLVar3->size != uVar4; uVar4 = uVar4 + 1) {
        uVar1 = pLVar3->literals[uVar4];
        uVar5 = -uVar1;
        if (0 < (int)uVar1) {
          uVar5 = uVar1;
        }
        if ((int)uVar6 < (int)uVar5) {
          uVar6 = (ulong)uVar5;
        }
      }
    }
  }
  printf("p cnf %d %lu\n",uVar6,this->num_clauses);
  for (uVar6 = 0; uVar6 < this->size_clauses; uVar6 = uVar6 + 1) {
    pLVar3 = (LratCheckerClause *)(this->clauses + uVar6);
    while (pLVar3 = pLVar3->next, pLVar3 != (LratCheckerClause *)0x0) {
      for (uVar4 = 0; uVar4 < pLVar3->size; uVar4 = uVar4 + 1) {
        printf("%d ",(ulong)(uint)pLVar3->literals[uVar4]);
      }
      puts("0");
    }
  }
  return;
}

Assistant:

void LratChecker::dump () {
  int max_var = 0;
  for (uint64_t i = 0; i < size_clauses; i++)
    for (LratCheckerClause *c = clauses[i]; c; c = c->next)
      for (unsigned i = 0; i < c->size; i++)
        if (abs (c->literals[i]) > max_var)
          max_var = abs (c->literals[i]);
  printf ("p cnf %d %" PRIu64 "\n", max_var, num_clauses);
  for (uint64_t i = 0; i < size_clauses; i++)
    for (LratCheckerClause *c = clauses[i]; c; c = c->next) {
      for (unsigned i = 0; i < c->size; i++)
        printf ("%d ", c->literals[i]);
      printf ("0\n");
    }
}